

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arbitrary.h
# Opt level: O2

vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
* cppqc::ArbitraryImpl<std::vector<int,_std::allocator<int>_>_>::shrink
            (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *__return_storage_ptr__,vector<int,_std::allocator<int>_> *v)

{
  long *local_20;
  _Head_base<0UL,_cppqc::detail::StatelessGenConcept<int>_*,_false> local_18;
  
  local_18._M_head_impl = (StatelessGenConcept<int> *)operator_new(0x10);
  ((local_18._M_head_impl)->super_GenConcept<int>)._vptr_GenConcept =
       (_func_int **)&PTR__GenConcept_00113cd8;
  listOf<int>((cppqc *)&local_20,(StatelessGenerator<int> *)&local_18);
  (**(code **)(*local_20 + 0x18))(__return_storage_ptr__,local_20,v);
  if (local_20 != (long *)0x0) {
    (**(code **)(*local_20 + 8))();
  }
  local_20 = (long *)0x0;
  if (local_18._M_head_impl != (StatelessGenConcept<int> *)0x0) {
    (*((local_18._M_head_impl)->super_GenConcept<int>)._vptr_GenConcept[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<std::vector<T>> shrink(const std::vector<T>& v) {
    return listOf<T>().shrink(v);
  }